

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_saveDict(LZ4_stream_t *LZ4_dict,char *safeBuffer,int dictSize)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (LZ4_dict->internal_donotuse).dictSize;
  if (uVar1 <= (uint)dictSize) {
    dictSize = uVar1;
  }
  uVar2 = 0x10000;
  if ((uint)dictSize < 0x10000) {
    uVar2 = dictSize;
  }
  memmove(safeBuffer,(LZ4_dict->internal_donotuse).dictionary + ((ulong)uVar1 - (ulong)uVar2),
          (ulong)uVar2);
  (LZ4_dict->internal_donotuse).dictionary = (uint8_t *)safeBuffer;
  (LZ4_dict->internal_donotuse).dictSize = uVar2;
  return uVar2;
}

Assistant:

int LZ4_saveDict (LZ4_stream_t* LZ4_dict, char* safeBuffer, int dictSize)
{
    LZ4_stream_t_internal* const dict = &LZ4_dict->internal_donotuse;
    const BYTE* const previousDictEnd = dict->dictionary + dict->dictSize;

    if ((U32)dictSize > 64 KB) { dictSize = 64 KB; } /* useless to define a dictionary > 64 KB */
    if ((U32)dictSize > dict->dictSize) { dictSize = (int)dict->dictSize; }

    memmove(safeBuffer, previousDictEnd - dictSize, dictSize);

    dict->dictionary = (const BYTE*)safeBuffer;
    dict->dictSize = (U32)dictSize;

    return dictSize;
}